

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall QMimeXMLProvider::addAllMimeTypes(QMimeXMLProvider *this,QList<QMimeType> *result)

{
  bool bVar1;
  byte bVar2;
  const_iterator o;
  QMimeTypePrivate *in_RSI;
  long in_FS_OFFSET;
  QString newMime;
  const_iterator end_1;
  const_iterator it_1;
  const_iterator end;
  const_iterator it;
  QString *in_stack_fffffffffffffea8;
  QMimeTypePrivate *in_stack_fffffffffffffeb0;
  QMimeTypePrivate *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  QHash<QString,_QMimeTypeXMLData> *in_stack_fffffffffffffec8;
  anon_class_24_1_f152a4d4_for__M_pred *in_stack_fffffffffffffee0;
  const_iterator in_stack_ffffffffffffff30;
  const_iterator in_stack_ffffffffffffff38;
  const_iterator local_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  piter local_70;
  piter local_60;
  piter local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QList<QMimeType>::isEmpty((QList<QMimeType> *)0x8fecc0);
  if (bVar1) {
    local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_18.d = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = (piter)QHash<QString,_QMimeTypeXMLData>::constBegin(in_stack_fffffffffffffec8);
    local_28.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = (piter)QHash<QString,_QMimeTypeXMLData>::constEnd
                                ((QHash<QString,_QMimeTypeXMLData> *)in_stack_fffffffffffffeb8);
    while (bVar1 = QHash<QString,_QMimeTypeXMLData>::const_iterator::operator!=
                             ((const_iterator *)in_stack_fffffffffffffeb8,
                              (const_iterator *)in_stack_fffffffffffffeb0), bVar1) {
      QHash<QString,_QMimeTypeXMLData>::const_iterator::value((const_iterator *)0x8fed76);
      QMimeTypePrivate::QMimeTypePrivate(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      QMimeType::QMimeType
                ((QMimeType *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
      QList<QMimeType>::append
                ((QList<QMimeType> *)in_stack_fffffffffffffeb0,(rvalue_ref)in_stack_fffffffffffffea8
                );
      QMimeType::~QMimeType((QMimeType *)0x8fedc4);
      QMimeTypePrivate::~QMimeTypePrivate((QMimeTypePrivate *)0x8fedd1);
      QHash<QString,_QMimeTypeXMLData>::const_iterator::operator++
                ((const_iterator *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    }
  }
  else {
    local_60.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_60.d = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = (piter)QHash<QString,_QMimeTypeXMLData>::constBegin(in_stack_fffffffffffffec8);
    local_70.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_70.d = (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_70 = (piter)QHash<QString,_QMimeTypeXMLData>::constEnd
                                ((QHash<QString,_QMimeTypeXMLData> *)in_stack_fffffffffffffeb8);
    while (bVar1 = QHash<QString,_QMimeTypeXMLData>::const_iterator::operator!=
                             ((const_iterator *)in_stack_fffffffffffffeb8,
                              (const_iterator *)in_stack_fffffffffffffeb0), bVar1) {
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      QHash<QString,_QMimeTypeXMLData>::const_iterator::key((const_iterator *)0x8feef1);
      QString::QString((QString *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      QList<QMimeType>::constBegin((QList<QMimeType> *)in_stack_fffffffffffffeb0);
      QList<QMimeType>::constEnd((QList<QMimeType> *)in_stack_fffffffffffffeb0);
      QString::QString((QString *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_90 = std::
                 find_if<QList<QMimeType>::const_iterator,QMimeXMLProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                           (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                            in_stack_fffffffffffffee0);
      o = QList<QMimeType>::constEnd((QList<QMimeType> *)in_stack_fffffffffffffeb0);
      bVar2 = QList<QMimeType>::const_iterator::operator==(&local_90,o);
      addAllMimeTypes(QList<QMimeType>&)::$_0::~__0
                ((anon_class_24_1_f152a4d4_for__M_pred *)0x8fef97);
      if ((bVar2 & 1) != 0) {
        in_stack_fffffffffffffeb8 = in_RSI;
        QHash<QString,_QMimeTypeXMLData>::const_iterator::value((const_iterator *)0x8fefbb);
        QMimeTypePrivate::QMimeTypePrivate(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        QMimeType::QMimeType
                  ((QMimeType *)CONCAT17(bVar2,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8)
        ;
        QList<QMimeType>::append
                  ((QList<QMimeType> *)in_stack_fffffffffffffeb0,
                   (rvalue_ref)in_stack_fffffffffffffea8);
        QMimeType::~QMimeType((QMimeType *)0x8ff009);
        QMimeTypePrivate::~QMimeTypePrivate((QMimeTypePrivate *)0x8ff016);
      }
      QString::~QString((QString *)0x8ff09c);
      QHash<QString,_QMimeTypeXMLData>::const_iterator::operator++
                ((const_iterator *)CONCAT17(bVar2,in_stack_fffffffffffffec0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::addAllMimeTypes(QList<QMimeType> &result)
{
    if (result.isEmpty()) { // fast path
        for (auto it = m_nameMimeTypeMap.constBegin(), end = m_nameMimeTypeMap.constEnd();
             it != end; ++it) {
            result.append(QMimeType(QMimeTypePrivate(it.value().name)));
        }
    } else {
        for (auto it = m_nameMimeTypeMap.constBegin(), end = m_nameMimeTypeMap.constEnd() ; it != end ; ++it) {
            const QString newMime = it.key();
            if (std::find_if(result.constBegin(), result.constEnd(), [newMime](const QMimeType &mime) -> bool { return mime.name() == newMime; })
                    == result.constEnd())
                result.append(QMimeType(QMimeTypePrivate(it.value().name)));
        }
    }
}